

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.h
# Opt level: O0

SpotLight * __thiscall
embree::SceneGraph::SpotLight::transform(SpotLight *this,AffineSpace3fa *space)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 *in_RDX;
  long in_RSI;
  SpotLight *in_RDI;
  undefined8 local_6d8;
  undefined8 uStack_6d0;
  undefined8 local_6c8;
  undefined8 uStack_6c0;
  undefined8 local_6b8;
  undefined8 uStack_6b0;
  undefined8 local_6a8;
  undefined8 uStack_6a0;
  undefined8 local_698;
  undefined8 uStack_690;
  float *local_688;
  undefined1 *local_678;
  float local_66c;
  undefined8 *local_668;
  float local_65c;
  undefined8 *local_658;
  float local_64c;
  undefined8 *local_648;
  float *local_640;
  undefined1 *local_630;
  undefined8 local_628;
  undefined8 uStack_620;
  undefined8 local_618;
  undefined8 uStack_610;
  undefined8 local_608;
  undefined8 uStack_600;
  undefined8 local_5f8;
  undefined8 uStack_5f0;
  undefined8 local_5e8;
  undefined8 uStack_5e0;
  float *local_5d0;
  undefined1 *local_5c0;
  float local_5b4;
  undefined8 *local_5b0;
  float local_5a4;
  undefined8 *local_5a0;
  float local_594;
  undefined8 *local_590;
  undefined8 local_588;
  undefined8 uStack_580;
  undefined8 *local_570;
  undefined8 *local_560;
  undefined1 *local_558;
  undefined8 *local_550;
  undefined8 *local_548;
  undefined1 *local_540;
  float local_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  undefined1 *local_520;
  undefined8 local_518;
  undefined8 uStack_510;
  undefined8 *local_500;
  undefined8 *local_4f8;
  undefined8 *local_4f0;
  undefined8 *local_4e8;
  undefined8 *local_4e0;
  undefined8 *local_4d8;
  undefined8 *local_4d0;
  float local_4c8;
  float fStack_4c4;
  float fStack_4c0;
  float fStack_4bc;
  undefined8 *local_4b0;
  undefined8 local_4a8;
  undefined8 uStack_4a0;
  undefined8 *local_490;
  undefined8 *local_480;
  undefined1 *local_478;
  undefined8 *local_470;
  undefined8 *local_468;
  undefined1 *local_460;
  float local_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  undefined1 *local_440;
  undefined8 local_438;
  undefined8 uStack_430;
  undefined8 *local_420;
  undefined8 *local_418;
  undefined8 *local_410;
  undefined8 *local_408;
  undefined8 *local_400;
  undefined8 *local_3f8;
  undefined8 *local_3f0;
  float local_3e8;
  float fStack_3e4;
  float fStack_3e0;
  float fStack_3dc;
  undefined8 *local_3d0;
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  undefined8 *local_3b0;
  undefined8 *local_3a8;
  undefined8 *local_3a0;
  undefined8 *local_398;
  undefined8 *local_390;
  undefined8 *local_388;
  undefined8 *local_380;
  float local_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  undefined8 *local_368;
  undefined8 *local_360;
  undefined8 *local_358;
  undefined8 *local_350;
  float local_348;
  float fStack_344;
  float fStack_340;
  float fStack_33c;
  undefined8 *local_338;
  undefined8 *local_330;
  undefined8 *local_328;
  undefined8 *local_320;
  float local_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  undefined8 *local_308;
  undefined8 *local_2f8;
  undefined8 *local_2f0;
  float local_2e8;
  float fStack_2e4;
  float fStack_2e0;
  float fStack_2dc;
  undefined8 *local_2d8;
  undefined8 *local_2d0;
  undefined8 *local_2c8;
  undefined8 *local_2c0;
  float local_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  undefined8 *local_2a8;
  undefined8 *local_298;
  undefined8 *local_290;
  float local_288;
  float fStack_284;
  float fStack_280;
  float fStack_27c;
  undefined8 *local_278;
  undefined8 *local_270;
  undefined8 *local_268;
  undefined8 *local_260;
  float local_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  undefined8 *local_240;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float local_168;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float local_13c;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float local_11c;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float local_fc;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float local_dc;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float local_bc;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  undefined8 local_88;
  undefined8 uStack_80;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  undefined8 local_68;
  undefined8 uStack_60;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  undefined8 local_48;
  undefined8 uStack_40;
  float local_38;
  float fStack_34;
  float fStack_30;
  float fStack_2c;
  undefined8 local_28;
  undefined8 uStack_20;
  
  local_688 = (float *)(in_RSI + 0x10);
  local_678 = &stack0xfffffffffffff8f8;
  local_64c = *local_688;
  local_648 = &local_698;
  local_1c8 = CONCAT44(local_64c,local_64c);
  uStack_1c0 = CONCAT44(local_64c,local_64c);
  local_65c = *(float *)(in_RSI + 0x14);
  local_658 = &local_6b8;
  local_1a8 = CONCAT44(local_65c,local_65c);
  uStack_1a0 = CONCAT44(local_65c,local_65c);
  local_418 = in_RDX + 2;
  local_66c = *(float *)(in_RSI + 0x18);
  local_668 = &local_6d8;
  local_188 = CONCAT44(local_66c,local_66c);
  uStack_180 = CONCAT44(local_66c,local_66c);
  local_3a8 = in_RDX + 4;
  local_3b0 = in_RDX + 6;
  local_420 = &local_6c8;
  local_388 = &local_3c8;
  uVar1 = *local_3a8;
  uVar2 = in_RDX[5];
  local_198._0_4_ = (float)uVar1;
  local_198._4_4_ = (float)((ulong)uVar1 >> 0x20);
  uStack_190._0_4_ = (float)uVar2;
  uStack_190._4_4_ = (float)((ulong)uVar2 >> 0x20);
  local_348 = local_66c * (float)local_198;
  fStack_344 = local_66c * local_198._4_4_;
  fStack_340 = local_66c * (float)uStack_190;
  fStack_33c = local_66c * uStack_190._4_4_;
  local_a8 = CONCAT44(fStack_344,local_348);
  uStack_a0 = CONCAT44(fStack_33c,fStack_340);
  uVar3 = *local_3b0;
  uVar4 = in_RDX[7];
  local_b8._0_4_ = (float)uVar3;
  local_b8._4_4_ = (float)((ulong)uVar3 >> 0x20);
  uStack_b0._0_4_ = (float)uVar4;
  uStack_b0._4_4_ = (float)((ulong)uVar4 >> 0x20);
  local_378 = local_348 + (float)local_b8;
  fStack_374 = fStack_344 + local_b8._4_4_;
  fStack_370 = fStack_340 + (float)uStack_b0;
  fStack_36c = fStack_33c + uStack_b0._4_4_;
  local_490 = &local_6a8;
  local_3f8 = &local_438;
  uVar5 = *local_418;
  uVar6 = in_RDX[3];
  local_1b8._0_4_ = (float)uVar5;
  local_1b8._4_4_ = (float)((ulong)uVar5 >> 0x20);
  uStack_1b0._0_4_ = (float)uVar6;
  uStack_1b0._4_4_ = (float)((ulong)uVar6 >> 0x20);
  local_318 = local_65c * (float)local_1b8;
  fStack_314 = local_65c * local_1b8._4_4_;
  fStack_310 = local_65c * (float)uStack_1b0;
  fStack_30c = local_65c * uStack_1b0._4_4_;
  local_88 = CONCAT44(fStack_314,local_318);
  uStack_80 = CONCAT44(fStack_30c,fStack_310);
  local_98 = (float)local_6c8;
  fStack_94 = (float)((ulong)local_6c8 >> 0x20);
  fStack_90 = (float)uStack_6c0;
  fStack_8c = (float)((ulong)uStack_6c0 >> 0x20);
  local_3e8 = local_318 + local_98;
  fStack_3e4 = fStack_314 + fStack_94;
  fStack_3e0 = fStack_310 + fStack_90;
  fStack_3dc = fStack_30c + fStack_8c;
  local_468 = &local_4a8;
  uVar7 = *in_RDX;
  uVar8 = in_RDX[1];
  local_1d8._0_4_ = (float)uVar7;
  local_1d8._4_4_ = (float)((ulong)uVar7 >> 0x20);
  uStack_1d0._0_4_ = (float)uVar8;
  uStack_1d0._4_4_ = (float)((ulong)uVar8 >> 0x20);
  local_2e8 = local_64c * (float)local_1d8;
  fStack_2e4 = local_64c * local_1d8._4_4_;
  fStack_2e0 = local_64c * (float)uStack_1d0;
  fStack_2dc = local_64c * uStack_1d0._4_4_;
  local_68 = CONCAT44(fStack_2e4,local_2e8);
  uStack_60 = CONCAT44(fStack_2dc,fStack_2e0);
  local_78 = (float)local_6a8;
  fStack_74 = (float)((ulong)local_6a8 >> 0x20);
  fStack_70 = (float)uStack_6a0;
  fStack_6c = (float)((ulong)uStack_6a0 >> 0x20);
  local_458 = local_2e8 + local_78;
  fStack_454 = fStack_2e4 + fStack_74;
  fStack_450 = fStack_2e0 + fStack_70;
  fStack_44c = fStack_2dc + fStack_6c;
  local_640 = (float *)(in_RSI + 0x20);
  local_630 = &stack0xfffffffffffff8e8;
  local_5b4 = *local_640;
  local_5b0 = &local_5e8;
  local_208 = CONCAT44(local_5b4,local_5b4);
  uStack_200 = CONCAT44(local_5b4,local_5b4);
  local_5a4 = *(float *)(in_RSI + 0x24);
  local_5a0 = &local_608;
  local_1e8 = CONCAT44(local_5a4,local_5a4);
  uStack_1e0 = CONCAT44(local_5a4,local_5a4);
  local_4f8 = in_RDX + 2;
  local_594 = *(float *)(in_RSI + 0x28);
  local_590 = &local_628;
  local_228 = CONCAT44(local_594,local_594);
  uStack_220 = CONCAT44(local_594,local_594);
  local_270 = in_RDX + 4;
  local_260 = &local_618;
  local_268 = &local_628;
  uVar9 = *local_270;
  uVar10 = in_RDX[5];
  local_238._0_4_ = (float)uVar9;
  local_238._4_4_ = (float)((ulong)uVar9 >> 0x20);
  uStack_230._0_4_ = (float)uVar10;
  uStack_230._4_4_ = (float)((ulong)uVar10 >> 0x20);
  local_258 = local_594 * (float)local_238;
  fStack_254 = local_594 * local_238._4_4_;
  fStack_250 = local_594 * (float)uStack_230;
  fStack_24c = local_594 * uStack_230._4_4_;
  local_240 = &local_618;
  local_4e8 = &local_5f8;
  local_4f0 = &local_608;
  local_500 = &local_618;
  local_2c0 = &local_518;
  uVar11 = *local_4f8;
  uVar12 = in_RDX[3];
  local_1f8._0_4_ = (float)uVar11;
  local_1f8._4_4_ = (float)((ulong)uVar11 >> 0x20);
  uStack_1f0._0_4_ = (float)uVar12;
  uStack_1f0._4_4_ = (float)((ulong)uVar12 >> 0x20);
  local_2b8 = local_5a4 * (float)local_1f8;
  fStack_2b4 = local_5a4 * local_1f8._4_4_;
  fStack_2b0 = local_5a4 * (float)uStack_1f0;
  fStack_2ac = local_5a4 * uStack_1f0._4_4_;
  local_2a8 = &local_518;
  local_48 = CONCAT44(fStack_2b4,local_2b8);
  uStack_40 = CONCAT44(fStack_2ac,fStack_2b0);
  local_4d0 = &local_5f8;
  local_4d8 = &local_518;
  local_58 = (float)local_618;
  fStack_54 = (float)((ulong)local_618 >> 0x20);
  fStack_50 = (float)uStack_610;
  fStack_4c = (float)((ulong)uStack_610 >> 0x20);
  local_4c8 = local_2b8 + local_58;
  fStack_4c4 = fStack_2b4 + fStack_54;
  fStack_4c0 = fStack_2b0 + fStack_50;
  fStack_4bc = fStack_2ac + fStack_4c;
  local_4b0 = &local_5f8;
  local_558 = &stack0xfffffffffffff8e8;
  local_560 = &local_5e8;
  local_570 = &local_5f8;
  local_290 = &local_588;
  uVar13 = *in_RDX;
  uVar14 = in_RDX[1];
  local_218._0_4_ = (float)uVar13;
  local_218._4_4_ = (float)((ulong)uVar13 >> 0x20);
  uStack_210._0_4_ = (float)uVar14;
  uStack_210._4_4_ = (float)((ulong)uVar14 >> 0x20);
  local_288 = local_5b4 * (float)local_218;
  fStack_284 = local_5b4 * local_218._4_4_;
  fStack_280 = local_5b4 * (float)uStack_210;
  fStack_27c = local_5b4 * uStack_210._4_4_;
  local_278 = &local_588;
  local_28 = CONCAT44(fStack_284,local_288);
  uStack_20 = CONCAT44(fStack_27c,fStack_280);
  local_540 = &stack0xfffffffffffff8e8;
  local_548 = &local_588;
  local_38 = (float)local_5f8;
  fStack_34 = (float)((ulong)local_5f8 >> 0x20);
  fStack_30 = (float)uStack_5f0;
  fStack_2c = (float)((ulong)uStack_5f0 >> 0x20);
  local_538 = local_288 + local_38;
  fStack_534 = fStack_284 + fStack_34;
  fStack_530 = fStack_280 + fStack_30;
  fStack_52c = fStack_27c + fStack_2c;
  local_520 = &stack0xfffffffffffff8e8;
  local_5d0 = local_640;
  local_5c0 = local_630;
  local_550 = local_570;
  local_4e0 = local_500;
  local_480 = local_648;
  local_478 = local_678;
  local_470 = local_490;
  local_460 = local_678;
  local_440 = local_678;
  local_410 = local_658;
  local_408 = local_490;
  local_400 = local_420;
  local_3f0 = local_490;
  local_3d0 = local_490;
  local_3a0 = local_668;
  local_398 = local_420;
  local_390 = local_3b0;
  local_380 = local_420;
  local_368 = local_420;
  local_360 = local_3a8;
  local_358 = local_668;
  local_350 = local_388;
  local_338 = local_388;
  local_330 = local_418;
  local_328 = local_658;
  local_320 = local_3f8;
  local_308 = local_3f8;
  local_2f8 = local_648;
  local_2f0 = local_468;
  local_2d8 = local_468;
  local_2d0 = local_4f8;
  local_2c8 = local_4f0;
  local_298 = local_560;
  local_238 = uVar9;
  uStack_230 = uVar10;
  local_218 = uVar13;
  uStack_210 = uVar14;
  local_1f8 = uVar11;
  uStack_1f0 = uVar12;
  local_1d8 = uVar7;
  uStack_1d0 = uVar8;
  local_1b8 = uVar5;
  uStack_1b0 = uVar6;
  local_198 = uVar1;
  uStack_190 = uVar2;
  local_178 = local_594;
  fStack_174 = local_594;
  fStack_170 = local_594;
  fStack_16c = local_594;
  local_168 = local_594;
  local_158 = local_5a4;
  fStack_154 = local_5a4;
  fStack_150 = local_5a4;
  fStack_14c = local_5a4;
  local_13c = local_5a4;
  local_138 = local_5b4;
  fStack_134 = local_5b4;
  fStack_130 = local_5b4;
  fStack_12c = local_5b4;
  local_11c = local_5b4;
  local_118 = local_64c;
  fStack_114 = local_64c;
  fStack_110 = local_64c;
  fStack_10c = local_64c;
  local_fc = local_64c;
  local_f8 = local_65c;
  fStack_f4 = local_65c;
  fStack_f0 = local_65c;
  fStack_ec = local_65c;
  local_dc = local_65c;
  local_d8 = local_66c;
  fStack_d4 = local_66c;
  fStack_d0 = local_66c;
  fStack_cc = local_66c;
  local_bc = local_66c;
  local_b8 = uVar3;
  uStack_b0 = uVar4;
  local_6d8 = local_188;
  uStack_6d0 = uStack_180;
  local_6c8 = CONCAT44(fStack_374,local_378);
  uStack_6c0 = CONCAT44(fStack_36c,fStack_370);
  local_6b8 = local_1a8;
  uStack_6b0 = uStack_1a0;
  local_6a8 = CONCAT44(fStack_3e4,local_3e8);
  uStack_6a0 = CONCAT44(fStack_3dc,fStack_3e0);
  local_698 = local_1c8;
  uStack_690 = uStack_1c0;
  local_628 = local_228;
  uStack_620 = uStack_220;
  local_618 = CONCAT44(fStack_254,local_258);
  uStack_610 = CONCAT44(fStack_24c,fStack_250);
  local_608 = local_1e8;
  uStack_600 = uStack_1e0;
  local_5f8 = CONCAT44(fStack_4c4,local_4c8);
  uStack_5f0 = CONCAT44(fStack_4bc,fStack_4c0);
  local_5e8 = local_208;
  uStack_5e0 = uStack_200;
  local_588 = local_28;
  uStack_580 = uStack_20;
  local_518 = local_48;
  uStack_510 = uStack_40;
  local_4a8 = local_68;
  uStack_4a0 = uStack_60;
  local_438 = local_88;
  uStack_430 = uStack_80;
  local_3c8 = local_a8;
  uStack_3c0 = uStack_a0;
  SpotLight((SpotLight *)CONCAT44(fStack_44c,fStack_450),(Vec3fa *)CONCAT44(fStack_454,local_458),
            (Vec3fa *)CONCAT44(fStack_52c,fStack_530),(Vec3fa *)CONCAT44(fStack_534,local_538),
            (float)((ulong)in_RDI >> 0x20),SUB84(in_RDI,0));
  return in_RDI;
}

Assistant:

SpotLight transform(const AffineSpace3fa& space) const {
        return SpotLight(xfmPoint(space,P),xfmVector(space,D),I,angleMin,angleMax);
      }